

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O2

void __thiscall
xray_re::cse_alife_item::state_read(cse_alife_item *this,xr_packet *packet,uint16_t size)

{
  bool bVar1;
  
  cse_alife_dynamic_object_visual::state_read(&this->super_cse_alife_dynamic_object_visual,packet,0)
  ;
  bVar1 = xr_clsid::operator==
                    (&(this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
                      super_cse_alife_object.super_cse_abstract.m_clsid,"W_BINOC");
  if ((bVar1) &&
     ((this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
      super_cse_alife_object.super_cse_abstract.m_version < 0x25)) {
    xr_packet::r<short>(packet);
    xr_packet::r<short>(packet);
    xr_packet::r<signed_char>(packet);
  }
  cse_alife_inventory_item::state_read(&this->super_cse_alife_inventory_item,packet,0);
  return;
}

Assistant:

void cse_alife_item::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_dynamic_object_visual::state_read(packet, size);
	if (m_clsid == "W_BINOC" && m_version < CSE_VERSION_0x25) {
		packet.r_s16();
		packet.r_s16();
		packet.r_s8();
	}
	cse_alife_inventory_item::state_read(packet, size);
}